

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  Type TVar1;
  bool bVar2;
  Result RVar3;
  uint8_t mutable_;
  uint32_t type;
  bool local_2d;
  Type local_2c;
  
  local_2d = false;
  local_2c.enum_ = Any;
  RVar3 = ReadS32Leb128(this,(uint32_t *)&local_2c,"global type");
  TVar1.enum_ = local_2c.enum_;
  if (RVar3.enum_ != Error) {
    bVar2 = IsConcreteType((BinaryReader *)this->options_,local_2c);
    if (bVar2) {
      RVar3 = ReadU8(this,&local_2d,"global mutability");
      if (RVar3.enum_ == Error) {
        return (Result)Error;
      }
      if (local_2d < 2) {
        out_type->enum_ = (Enum)TVar1;
        *out_mutable = local_2d;
        return (Result)Ok;
      }
      PrintError(this,"global mutability must be 0 or 1");
      return (Result)Error;
    }
    PrintError(this,"invalid global type: %#x",(ulong)(uint)TVar1.enum_);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}